

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
MaybeAlive<Lib::Stack<std::unique_ptr<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>_>_>
::~MaybeAlive(MaybeAlive<Lib::Stack<std::unique_ptr<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>_>_>
              *this)

{
  *this->_alive = false;
  Stack<std::unique_ptr<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>_>::~Stack
            (&this->_self);
  return;
}

Assistant:

~MaybeAlive() { *_alive = false; }